

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-dump.cpp
# Opt level: O0

void printName(PSNode *node,bool dot)

{
  byte bVar1;
  bool bVar2;
  IDType IVar3;
  PSNodeType PVar4;
  Value *pVVar5;
  undefined8 uVar6;
  byte in_SIL;
  PSNode *in_RDI;
  int i;
  PSNodeEntry *entry;
  PSNode *paired;
  char *name;
  string nm;
  Value *in_stack_00000148;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int iVar7;
  string local_98 [32];
  PSNodeEntry *local_78;
  PSNode *local_70;
  Pointer local_50;
  undefined4 local_3c;
  char *local_38;
  string local_30 [31];
  undefined1 in_stack_ffffffffffffffef;
  undefined7 in_stack_fffffffffffffff0;
  
  bVar1 = in_SIL & 1;
  std::__cxx11::string::string(local_30);
  local_38 = (char *)0x0;
  bVar2 = dg::pta::PSNode::isNull(in_RDI);
  if (bVar2) {
    local_38 = "null";
  }
  else {
    bVar2 = dg::pta::PSNode::isUnknownMemory(in_RDI);
    if (bVar2) {
      local_38 = "unknown";
    }
    else {
      bVar2 = dg::pta::PSNode::isInvalidated(in_RDI);
      if ((bVar2) &&
         (pVVar5 = dg::SubgraphNode<dg::pta::PSNode>::getUserData<llvm::Value>
                             ((SubgraphNode<dg::pta::PSNode> *)(in_RDI + 8)), pVVar5 == (Value *)0x0
         )) {
        local_38 = "invalidated";
      }
    }
  }
  if (local_38 == (char *)0x0) {
    bVar2 = llvm::cl::opt_storage::operator_cast_to_bool
                      ((opt_storage<bool,_false,_false> *)0x165469);
    if (bVar2) {
      IVar3 = dg::SubgraphNode<dg::pta::PSNode>::getID
                        ((SubgraphNode<dg::pta::PSNode> *)(in_RDI + 8));
      printf(" <%u>",(ulong)IVar3);
      local_3c = 1;
      goto LAB_0016570b;
    }
    pVVar5 = dg::SubgraphNode<dg::pta::PSNode>::getUserData<llvm::Value>
                       ((SubgraphNode<dg::pta::PSNode> *)(in_RDI + 8));
    if (pVVar5 == (Value *)0x0) {
      if ((bVar1 & 1) == 0) {
        IVar3 = dg::SubgraphNode<dg::pta::PSNode>::getID
                          ((SubgraphNode<dg::pta::PSNode> *)(in_RDI + 8));
        printf("<%u> ",(ulong)IVar3);
        dg::pta::PSNode::getType(in_RDI);
        printPSNodeType(0);
      }
      else {
        IVar3 = dg::SubgraphNode<dg::pta::PSNode>::getID
                          ((SubgraphNode<dg::pta::PSNode> *)(in_RDI + 8));
        printf("<%u> (no name)\\n",(ulong)IVar3);
        PVar4 = dg::pta::PSNode::getType(in_RDI);
        if (PVar4 == CONSTANT) {
          dg::pta::PointerIdPointsToSet::begin
                    ((PointerIdPointsToSet *)
                     CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
          local_50 = dg::pta::PointerIdPointsToSet::const_iterator::operator*
                               ((const_iterator *)
                                CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
          dumpPointer((Pointer *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                      (bool)in_stack_ffffffffffffff5f);
        }
        else {
          PVar4 = dg::pta::PSNode::getType(in_RDI);
          if (PVar4 == CALL_RETURN) {
            local_70 = dg::pta::PSNode::getPairedNode(in_RDI);
            if (local_70 != (PSNode *)0x0) {
              printName((PSNode *)CONCAT17(bVar1,in_stack_fffffffffffffff0),
                        (bool)in_stack_ffffffffffffffef);
            }
          }
          else {
            local_78 = dg::pta::PSNodeEntry::get
                                 ((PSNode *)
                                  CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
            if (local_78 != (PSNodeEntry *)0x0) {
              dg::pta::PSNodeEntry::getFunctionName_abi_cxx11_(local_78);
              uVar6 = std::__cxx11::string::c_str();
              printf("%s\\n",uVar6);
            }
          }
        }
      }
      local_3c = 1;
      goto LAB_0016570b;
    }
    dg::SubgraphNode<dg::pta::PSNode>::getUserData<llvm::Value>
              ((SubgraphNode<dg::pta::PSNode> *)(in_RDI + 8));
    getInstName_abi_cxx11_(in_stack_00000148);
    std::__cxx11::string::operator=(local_30,local_98);
    std::__cxx11::string::~string(local_98);
    local_38 = (char *)std::__cxx11::string::c_str();
  }
  bVar2 = llvm::cl::opt_storage::operator_cast_to_bool((opt_storage<bool,_false,_false> *)0x165663);
  if (bVar2) {
    IVar3 = dg::SubgraphNode<dg::pta::PSNode>::getID((SubgraphNode<dg::pta::PSNode> *)(in_RDI + 8));
    printf(" <%u>",(ulong)IVar3);
    local_3c = 1;
  }
  else {
    for (iVar7 = 0; local_38[iVar7] != '\0'; iVar7 = iVar7 + 1) {
      if (0x45 < iVar7) {
        printf(" ...");
        break;
      }
      if (local_38[iVar7] == '\"') {
        putchar(0x5c);
      }
      putchar((int)local_38[iVar7]);
    }
    local_3c = 0;
  }
LAB_0016570b:
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

static void printName(PSNode *node, bool dot = false) {
    std::string nm;
    const char *name = nullptr;
    if (node->isNull()) {
        name = "null";
    } else if (node->isUnknownMemory()) {
        name = "unknown";
    } else if (node->isInvalidated() && !node->getUserData<llvm::Value>()) {
        name = "invalidated";
    }

    if (!name) {
        if (ids_only) {
            printf(" <%u>", node->getID());
            return;
        }

        if (!node->getUserData<llvm::Value>()) {
            if (dot) {
                printf("<%u> (no name)\\n", node->getID());

                if (node->getType() == PSNodeType::CONSTANT) {
                    dumpPointer(*(node->pointsTo.begin()), dot);
                } else if (node->getType() == PSNodeType::CALL_RETURN) {
                    if (PSNode *paired = node->getPairedNode())
                        printName(paired, dot);
                } else if (PSNodeEntry *entry = PSNodeEntry::get(node)) {
                    printf("%s\\n", entry->getFunctionName().c_str());
                }
            } else {
                printf("<%u> ", node->getID());
                printPSNodeType(node->getType());
            }

            return;
        }

        nm = getInstName(node->getUserData<llvm::Value>());
        name = nm.c_str();
    }

    if (ids_only) {
        printf(" <%u>", node->getID());
        return;
    }

    // escape the " character
    for (int i = 0; name[i] != '\0'; ++i) {
        // crop long names
        if (i >= 70) {
            printf(" ...");
            break;
        }

        if (name[i] == '"')
            putchar('\\');

        putchar(name[i]);
    }
}